

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_struct_as_root_with_size
              (void *buf,size_t bufsiz,char *fid,size_t size,uint16_t align)

{
  int iVar1;
  size_t local_28;
  
  local_28 = bufsiz;
  iVar1 = flatcc_verify_buffer_header_with_size(buf,&local_28,fid);
  if (iVar1 != 0) {
    iVar1 = flatcc_verify_buffer_header_with_size(buf,&local_28,fid);
    return iVar1;
  }
  iVar1 = verify_struct((flatbuffers_uoffset_t)local_28,0,*buf,(flatbuffers_uoffset_t)size,align);
  return iVar1;
}

Assistant:

int flatcc_verify_struct_as_root_with_size(const void *buf, size_t bufsiz, const char *fid, size_t size, uint16_t align)
{
    check_result(flatcc_verify_buffer_header_with_size(buf, &bufsiz, fid));
    return verify_struct((uoffset_t)bufsiz, 0, read_uoffset(buf, 0), (uoffset_t)size, align);
}